

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

string * __thiscall
czh::lexer::Match::error_correct_abi_cxx11_(string *__return_storage_ptr__,Match *this)

{
  undefined8 extraout_RAX;
  char *__s;
  allocator<char> local_31;
  string local_30;
  source_location local_10;
  
  switch(this->last_state) {
  case INIT:
  case REF:
    __s = "identifier";
    break;
  case ID:
    __s = "\'=\' or \':\'";
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Unexpected token",&local_31);
    local_10._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_001953a0;
    czh::error::czh_unreachable(&local_30,&local_10);
    std::__cxx11::string::~string((string *)&local_30);
    _Unwind_Resume(extraout_RAX);
  case ARR_VALUE:
    __s = "\']\' or \',\'";
    break;
  case EQUAL:
    __s = "value or \'[\'";
    break;
  case ARR_LP:
    __s = "value or \']\'";
    break;
  case COMMA:
    __s = "value";
    break;
  case REF_ID:
    __s = "\'::\'";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string error_correct()
    {
      switch (last_state)
      {
        case State::REF:
        case State::INIT:
          return "identifier";
        case State::ID:
          return "'=' or ':'";
        case State::EQUAL:
          return "value or '['";
        case State::ARR_LP:
          return "value or ']'";
        case State::ARR_VALUE:
          return "']' or ','";
        case State::COMMA:
          return "value";
        case State::REF_ID:
          return "'::'";
        default:
          error::czh_unreachable("Unexpected token");
      }
      error::czh_unreachable("Unexpected token");
      return "";
    }